

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_routing.c
# Opt level: O0

int olsrv2_routing_init(void)

{
  int iVar1;
  int local_30;
  int local_2c;
  int i;
  
  iVar1 = os_core_linux_get_random(&_ansn,2);
  if (iVar1 == 0) {
    nhdp_domain_listener_add(&_nhdp_listener);
    memset(_domain_changed,0,4);
    _update_ansn = false;
    oonf_class_add(&_rtset_entry);
    oonf_timer_add(&_dijkstra_timer_info);
    for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
      avl_init(_routing_tree + local_30,os_routing_avl_cmp_route_key,false);
    }
    _routing_filter_list.prev = &_routing_filter_list;
    _routing_filter_list.next = &_routing_filter_list;
    avl_init(&_dijkstra_working_tree,avl_comp_uint32,true);
    _kernel_queue.prev = &_kernel_queue;
    _kernel_queue.next = &_kernel_queue;
    local_2c = 0;
  }
  else {
    local_2c = -1;
  }
  return local_2c;
}

Assistant:

int
olsrv2_routing_init(void) {
  int i;

  /* initialize domain change tracker */
  if (os_core_get_random(&_ansn, sizeof(_ansn))) {
    return -1;
  }

  nhdp_domain_listener_add(&_nhdp_listener);
  memset(_domain_changed, 0, sizeof(_domain_changed));
  _update_ansn = false;

  oonf_class_add(&_rtset_entry);
  oonf_timer_add(&_dijkstra_timer_info);

  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    avl_init(&_routing_tree[i], os_routing_avl_cmp_route_key, false);
  }
  list_init_head(&_routing_filter_list);
  avl_init(&_dijkstra_working_tree, avl_comp_uint32, true);
  list_init_head(&_kernel_queue);

  return 0;
}